

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::ConstructorOp::~ConstructorOp(ConstructorOp *this)

{
  pointer pSVar1;
  pointer ppEVar2;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_0018ce08;
  ppEVar2 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppEVar2 != (Expression *)0x0) {
        (*(*ppEVar2)->_vptr_Expression[1])();
      }
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 !=
             (this->m_inputExpressions).
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppEVar2 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->m_inputExpressions).
                                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::~vector(&this->m_inputValueRanges)
  ;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  ValueRange::~ValueRange(&this->m_valueRange);
  return;
}

Assistant:

ConstructorOp::~ConstructorOp (void)
{
	for (vector<Expression*>::iterator i = m_inputExpressions.begin(); i != m_inputExpressions.end(); i++)
		delete *i;
}